

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O2

void testEncoding(void)

{
  auto_ptr<avro::OutputStream> os;
  auto_ptr<avro::InputStream> is;
  EncoderPtr e;
  ValidSchema s;
  shared_count local_4a8;
  DecoderPtr d;
  RootRecord t1;
  RootRecord t2;
  ifstream ifs;
  
  avro::ValidSchema::ValidSchema(&s);
  std::ifstream::ifstream(&ifs,"jsonschemas/bigrecord",_S_in);
  avro::compileJsonSchema((istream *)&ifs,&s);
  avro::memoryOutputStream((ulong)&os);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&e,(shared_ptr *)&s);
  boost::detail::shared_count::~shared_count((shared_count *)&t1.nestedrecord);
  (**(code **)(*(long *)e.px + 0x10))(e.px,_os);
  testgen::RootRecord::RootRecord(&t1);
  setRecord(&t1);
  avro::codec_traits<testgen::RootRecord>::encode(e.px,&t1);
  (**(code **)(*(long *)e.px + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)&d,(shared_ptr *)&s);
  boost::detail::shared_count::~shared_count((shared_count *)&t2.nestedrecord);
  avro::memoryInputStream((OutputStream *)&is);
  (**(code **)(*(long *)d.px + 0x10))(d.px,_is);
  testgen::RootRecord::RootRecord(&t2);
  avro::codec_traits<testgen::RootRecord>::decode(d.px,&t2);
  checkRecord<testgen::RootRecord,testgen::RootRecord>(&t2,&t1);
  testgen::RootRecord::~RootRecord(&t2);
  if (_is != (long *)0x0) {
    (**(code **)(*_is + 8))();
  }
  boost::detail::shared_count::~shared_count(&d.pn);
  testgen::RootRecord::~RootRecord(&t1);
  boost::detail::shared_count::~shared_count(&e.pn);
  if (_os != (long *)0x0) {
    (**(code **)(*_os + 8))();
  }
  std::ifstream::~ifstream(&ifs);
  boost::detail::shared_count::~shared_count(&local_4a8);
  return;
}

Assistant:

void testEncoding()
{
    ValidSchema s;
    ifstream ifs("jsonschemas/bigrecord");
    compileJsonSchema(ifs, s);
    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    testgen::RootRecord t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    testgen::RootRecord t2;
    avro::decode(*d, t2);

    checkRecord(t2, t1);
}